

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O0

void uavs3d_if_hor_ver_luma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff_h,s8 *coeff_v,
               int max_val)

{
  sbyte sVar1;
  int local_876c;
  pel local_8768;
  int local_8764;
  s16 **local_8760;
  s16 *tmp;
  s16 tmp_res [17280];
  int shift2;
  int add2;
  int shift1;
  int add1;
  int val;
  int sum;
  int col;
  int row;
  int height_local;
  int width_local;
  int i_dst_local;
  pel *dst_local;
  pel *ppStack_10;
  int i_src_local;
  pel *src_local;
  
  if (max_val == 0xff) {
    shift2 = 0;
    sVar1 = 0xc;
  }
  else {
    shift2 = 2;
    sVar1 = 10;
  }
  ppStack_10 = src + i_src * -3;
  local_8760 = &tmp;
  if (shift2 == 0) {
    for (sum = -3; sum < height + 4; sum = sum + 1) {
      for (val = 0; val < width; val = val + 1) {
        *(ushort *)((long)local_8760 + (long)val * 2) =
             (ushort)ppStack_10[val + -3] * (short)*coeff_h +
             (ushort)ppStack_10[val + -2] * (short)coeff_h[1] +
             (ushort)ppStack_10[val + -1] * (short)coeff_h[2] +
             (ushort)ppStack_10[val] * (short)coeff_h[3] +
             (ushort)ppStack_10[val + 1] * (short)coeff_h[4] +
             (ushort)ppStack_10[val + 2] * (short)coeff_h[5] +
             (ushort)ppStack_10[val + 3] * (short)coeff_h[6] +
             (ushort)ppStack_10[val + 4] * (short)coeff_h[7];
      }
      ppStack_10 = ppStack_10 + i_src;
      local_8760 = (s16 **)((long)local_8760 + (long)width * 2);
    }
  }
  else {
    for (sum = -3; sum < height + 4; sum = sum + 1) {
      for (val = 0; val < width; val = val + 1) {
        *(short *)((long)local_8760 + (long)val * 2) =
             (short)((int)((uint)ppStack_10[val + -3] * (int)*coeff_h +
                           (uint)ppStack_10[val + -2] * (int)coeff_h[1] +
                           (uint)ppStack_10[val + -1] * (int)coeff_h[2] +
                           (uint)ppStack_10[val] * (int)coeff_h[3] +
                           (uint)ppStack_10[val + 1] * (int)coeff_h[4] +
                           (uint)ppStack_10[val + 2] * (int)coeff_h[5] +
                           (uint)ppStack_10[val + 3] * (int)coeff_h[6] +
                           (uint)ppStack_10[val + 4] * (int)coeff_h[7] + ((1 << (sbyte)shift2) >> 1)
                          ) >> (sbyte)shift2);
      }
      ppStack_10 = ppStack_10 + i_src;
      local_8760 = (s16 **)((long)local_8760 + (long)width * 2);
    }
  }
  local_8760 = (s16 **)(tmp_res + (long)(width * 3) + -4);
  _width_local = dst;
  for (sum = 0; sum < height; sum = sum + 1) {
    for (val = 0; val < width; val = val + 1) {
      local_876c = (int)*(short *)((long)local_8760 + (long)(val + width * -3) * 2) * (int)*coeff_v
                   + (int)*(short *)((long)local_8760 + (long)(val + width * -2) * 2) *
                     (int)coeff_v[1] +
                   (int)*(short *)((long)local_8760 + (long)(val - width) * 2) * (int)coeff_v[2] +
                   (int)*(short *)((long)local_8760 + (long)val * 2) * (int)coeff_v[3] +
                   (int)*(short *)((long)local_8760 + (long)(val + width) * 2) * (int)coeff_v[4] +
                   (int)*(short *)((long)local_8760 + (long)(val + width * 2) * 2) * (int)coeff_v[5]
                   + (int)*(short *)((long)local_8760 + (long)(val + width * 3) * 2) *
                     (int)coeff_v[6] +
                   (int)*(short *)((long)local_8760 + (long)(val + width * 4) * 2) * (int)coeff_v[7]
                   + (1 << (sVar1 - 1U & 0x1f)) >> sVar1;
      local_8764 = local_876c;
      if (max_val < local_876c) {
        local_8764 = max_val;
      }
      if (local_8764 < 0) {
        local_8768 = '\0';
      }
      else {
        if (max_val < local_876c) {
          local_876c = max_val;
        }
        local_8768 = (pel)local_876c;
      }
      _width_local[val] = local_8768;
    }
    _width_local = _width_local + i_dst;
    local_8760 = (s16 **)((long)local_8760 + (long)width * 2);
  }
  return;
}

Assistant:

static void uavs3d_if_hor_ver_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff_h, const s8 *coeff_v, int max_val)
{
    int row, col;
    int sum, val;
    int add1, shift1;
    int add2, shift2;

    ALIGNED_16(s16 tmp_res[(128 + 7) * 128]);
    s16 *tmp;

    if (max_val == 255) { // 8 bit_depth
        shift1 = 0;
        shift2 = 12;
    }
    else { // 10 bit_depth
        shift1 = 2;
        shift2 = 10;
    }

    add1 = (1 << (shift1)) >> 1;
    add2 = 1 << (shift2 - 1);

    src += -3 * i_src;
    tmp = tmp_res;

    if (shift1) {
        for (row = -3; row < height + 4; row++) {
            for (col = 0; col < width; col++) {
                sum = FLT_8TAP_HOR(src, col, coeff_h);
                tmp[col] = (sum + add1) >> shift1;
            }
            src += i_src;
            tmp += width;
        }
    }
    else {
        for (row = -3; row < height + 4; row++) {
            for (col = 0; col < width; col++) {
                tmp[col] = FLT_8TAP_HOR(src, col, coeff_h);
            }
            src += i_src;
            tmp += width;
        }
    }

    tmp = tmp_res + 3 * width;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_VER(tmp, col, width, coeff_v);
            val = (sum + add2) >> shift2;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        dst += i_dst;
        tmp += width;
    }
}